

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_stmt_explain(sqlite3_stmt *pStmt,int eMode)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  
  if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  uVar3 = *(uint *)(pStmt + 200);
  iVar2 = 0;
  if ((uVar3 >> 2 & 3) != eMode) {
    iVar2 = 1;
    if (((uint)eMode < 3) && ((char)pStmt[0xc6] < '\0')) {
      if (pStmt[199] == (sqlite3_stmt)0x1) {
        if ((*(int *)(pStmt + 0x24) < 10) || (eMode == 2 && (uVar3 >> 8 & 1) == 0)) {
          *(ushort *)(pStmt + 200) = (ushort)uVar3 & 0xfff3 | (short)eMode * 4;
          iVar2 = sqlite3Reprepare((Vdbe *)pStmt);
          uVar3 = *(uint *)(pStmt + 200) & 0xfffffeff | (uint)(eMode == 2) << 8;
        }
        else {
          uVar3 = uVar3 & 0xfffffff3 | eMode << 2;
          iVar2 = 0;
        }
        *(short *)(pStmt + 200) = (short)uVar3;
      }
      else {
        iVar2 = 5;
      }
    }
  }
  uVar3 = (uVar3 & 0xffff) >> 2;
  if ((uVar3 & 3) == 0) {
    uVar1 = *(ushort *)(pStmt + 0xc2);
  }
  else {
    uVar1 = ((ushort)uVar3 & 3) << 2 ^ 0xc;
  }
  *(ushort *)(pStmt + 0xc0) = uVar1;
  if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_stmt_explain(sqlite3_stmt *pStmt, int eMode){
  Vdbe *v = (Vdbe*)pStmt;
  int rc;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(v->db->mutex);
  if( ((int)v->explain)==eMode ){
    rc = SQLITE_OK;
  }else if( eMode<0 || eMode>2 ){
    rc = SQLITE_ERROR;
  }else if( (v->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ){
    rc = SQLITE_ERROR;
  }else if( v->eVdbeState!=VDBE_READY_STATE ){
    rc = SQLITE_BUSY;
  }else if( v->nMem>=10 && (eMode!=2 || v->haveEqpOps) ){
    /* No reprepare necessary */
    v->explain = eMode;
    rc = SQLITE_OK;
  }else{
    v->explain = eMode;
    rc = sqlite3Reprepare(v);
    v->haveEqpOps = eMode==2;
  }
  if( v->explain ){
    v->nResColumn = 12 - 4*v->explain;
  }else{
    v->nResColumn = v->nResAlloc;
  }
  sqlite3_mutex_leave(v->db->mutex);
  return rc;
}